

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 3DSExporter.cpp
# Opt level: O1

string * __thiscall
Assimp::(anonymous_namespace)::GetMeshName_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,aiMesh *mesh,uint index,
          aiNode *node)

{
  char *pcVar1;
  long lVar2;
  bool bVar3;
  int iVar4;
  long *plVar5;
  uint uVar6;
  undefined4 in_register_0000000c;
  size_type *psVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  bool bVar11;
  char *pcVar12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  char postfix [10];
  string result;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  char local_50 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  uVar10 = (ulong)mesh & 0xffffffff;
  if ((GetMeshName[abi:cxx11](aiMesh_const&,unsigned_int,aiNode_const&)::underscore_abi_cxx11_ ==
       '\0') && (iVar4 = __cxa_guard_acquire(), iVar4 != 0)) {
    GetMeshName[abi:cxx11](aiMesh_const&,unsigned_int,aiNode_const&)::underscore_abi_cxx11_.
    _M_dataplus._M_p =
         (pointer)&GetMeshName[abi:cxx11](aiMesh_const&,unsigned_int,aiNode_const&)::
                   underscore_abi_cxx11_.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)
               &GetMeshName[abi:cxx11](aiMesh_const&,unsigned_int,aiNode_const&)::
                underscore_abi_cxx11_,"_","");
    __cxa_atexit(std::__cxx11::string::~string,
                 &GetMeshName[abi:cxx11](aiMesh_const&,unsigned_int,aiNode_const&)::
                  underscore_abi_cxx11_,&__dso_handle);
    __cxa_guard_release();
  }
  local_50[8] = '\0';
  local_50[9] = '\0';
  local_50[0] = '\0';
  local_50[1] = '\0';
  local_50[2] = '\0';
  local_50[3] = '\0';
  local_50[4] = '\0';
  local_50[5] = '\0';
  local_50[6] = '\0';
  local_50[7] = '\0';
  if ((int)mesh < 0) {
    pcVar12 = local_50 + 1;
    local_50[0] = '-';
    local_50[1] = '\0';
    local_50[2] = '\0';
    local_50[3] = '\0';
    local_50[4] = '\0';
    local_50[5] = '\0';
    local_50[6] = '\0';
    local_50[7] = '\0';
    uVar10 = (ulong)(uint)-(int)mesh;
    uVar6 = 2;
  }
  else {
    pcVar12 = local_50;
    uVar6 = 1;
  }
  iVar4 = 1000000000;
  bVar11 = false;
  do {
    uVar9 = (uint)uVar10;
    if (9 < uVar6) break;
    uVar8 = (int)uVar9 % iVar4;
    if (((bVar11) || (iVar4 == 1)) || ((int)((long)(int)uVar9 / (long)iVar4) != 0)) {
      pcVar1 = pcVar12 + 1;
      uVar6 = uVar6 + 1;
      *pcVar12 = (char)((long)(int)uVar9 / (long)iVar4) + '0';
      bVar11 = true;
      pcVar12 = pcVar1;
      uVar9 = uVar8;
      if (iVar4 != 1) goto LAB_00310186;
      bVar3 = false;
      iVar4 = 1;
    }
    else {
LAB_00310186:
      uVar8 = uVar9;
      iVar4 = iVar4 / 10;
      bVar3 = true;
    }
    uVar10 = (ulong)uVar8;
  } while (bVar3);
  *pcVar12 = '\0';
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,(char *)(CONCAT44(in_register_0000000c,index) + 4),
             (allocator<char> *)&local_70);
  if (*(int *)(this + 0xec) != 0) {
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_70,
               GetMeshName[abi:cxx11](aiMesh_const&,unsigned_int,aiNode_const&)::
               underscore_abi_cxx11_._M_dataplus._M_p,
               GetMeshName[abi:cxx11](aiMesh_const&,unsigned_int,aiNode_const&)::
               underscore_abi_cxx11_._M_dataplus._M_p +
               GetMeshName[abi:cxx11](aiMesh_const&,unsigned_int,aiNode_const&)::
               underscore_abi_cxx11_._M_string_length);
    std::__cxx11::string::append((char *)&local_70);
    std::__cxx11::string::_M_append((char *)&local_40,(ulong)local_70._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
  }
  std::operator+(&local_70,&local_40,
                 &GetMeshName[abi:cxx11](aiMesh_const&,unsigned_int,aiNode_const&)::
                  underscore_abi_cxx11_);
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_70);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar7 = (size_type *)(plVar5 + 2);
  if ((size_type *)*plVar5 == psVar7) {
    lVar2 = plVar5[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar7;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar2;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar5;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar7;
  }
  __return_storage_ptr__->_M_string_length = plVar5[1];
  *plVar5 = (long)psVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GetMeshName(const aiMesh& mesh, unsigned int index, const aiNode& node) {
        static const std::string underscore = "_";
        char postfix[10] = {0};
        ASSIMP_itoa10(postfix, index);

        std::string result = node.mName.C_Str();
        if (mesh.mName.length > 0) {
            result += underscore + mesh.mName.C_Str();
        }
        return result + underscore + postfix;
    }